

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURL ** curl_multi_get_handles(CURLM *m)

{
  _Bool _Var1;
  Curl_easy *data;
  uint mid;
  uint i;
  CURL **a;
  CURL *pCStack_20;
  uint count;
  void *entry;
  Curl_multi *multi;
  CURLM *m_local;
  
  entry = m;
  multi = (Curl_multi *)m;
  a._4_4_ = Curl_uint_tbl_count((uint_tbl *)((long)m + 8));
  _mid = (CURL **)(*Curl_cmalloc)((ulong)(a._4_4_ + 1) << 3);
  if (_mid != (CURL **)0x0) {
    data._4_4_ = 0;
    _Var1 = Curl_uint_tbl_first((uint_tbl *)((long)entry + 8),(uint *)&data,&stack0xffffffffffffffe0
                               );
    if (_Var1) {
      do {
        if ((*(uint *)((long)pCStack_20 + 0x13be) >> 0x14 & 1) == 0) {
          _mid[data._4_4_] = pCStack_20;
          data._4_4_ = data._4_4_ + 1;
        }
        _Var1 = Curl_uint_tbl_next((uint_tbl *)((long)entry + 8),(uint)data,(uint *)&data,
                                   &stack0xffffffffffffffe0);
      } while (_Var1);
    }
    _mid[data._4_4_] = (CURL *)0x0;
  }
  return _mid;
}

Assistant:

CURL **curl_multi_get_handles(CURLM *m)
{
  struct Curl_multi *multi = m;
  void *entry;
  unsigned int count = Curl_uint_tbl_count(&multi->xfers);
  CURL **a = malloc(sizeof(struct Curl_easy *) * (count + 1));
  if(a) {
    unsigned int i = 0, mid;

    if(Curl_uint_tbl_first(&multi->xfers, &mid, &entry)) {
      do {
        struct Curl_easy *data = entry;
        DEBUGASSERT(i < count);
        if(!data->state.internal)
          a[i++] = data;
      }
      while(Curl_uint_tbl_next(&multi->xfers, mid, &mid, &entry));
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}